

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

bool __thiscall cmGhsMultiTargetGenerator::DetermineIfIntegrityApp(cmGhsMultiTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  size_type sVar1;
  bool bVar2;
  cmValue cVar3;
  char *extraout_RDX;
  _Alloc_hider this_01;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __it;
  long lVar4;
  long lVar5;
  _Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *p_Var6;
  string_view value;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  allocator<char> local_49;
  string local_48;
  
  this_00 = this->GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"ghs_integrity_app",&local_49);
  cVar3 = cmGeneratorTarget::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (cVar3.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
    return bVar2;
  }
  __it._M_current = (cmSourceFile **)&local_48;
  local_48.field_2._M_allocated_capacity = 0;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  cmGeneratorTarget::GetSourceFiles
            (this->GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)__it._M_current,
             &this->ConfigName);
  sVar1 = local_48._M_string_length;
  lVar4 = local_48._M_string_length - (long)local_48._M_dataplus._M_p;
  this_01._M_p = local_48._M_dataplus._M_p;
  for (lVar5 = lVar4 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>
            ::operator()((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                         this_01._M_p,__it);
    p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)this_01._M_p;
    if (bVar2) goto LAB_002b9cf4;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>
            ::operator()((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                         this_01._M_p + 8,__it);
    p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)this_01._M_p +
             8;
    if (bVar2) goto LAB_002b9cf4;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>
            ::operator()((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                         this_01._M_p + 0x10,__it);
    p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)this_01._M_p +
             0x10;
    if (bVar2) goto LAB_002b9cf4;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>
            ::operator()((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                         this_01._M_p + 0x18,__it);
    p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)this_01._M_p +
             0x18;
    if (bVar2) goto LAB_002b9cf4;
    this_01._M_p = this_01._M_p + 0x20;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)sVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>::operator()
                            ((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0>
                              *)this_01._M_p,__it),
         p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                  this_01._M_p, bVar2)) goto LAB_002b9cf4;
      this_01._M_p = this_01._M_p + 8;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>
            ::operator()((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                         this_01._M_p,__it);
    p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)this_01._M_p;
    if (bVar2) goto LAB_002b9cf4;
    this_01._M_p = this_01._M_p + 8;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::$_0>::
          operator()((_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)
                     this_01._M_p,__it);
  p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)this_01._M_p;
  if (!bVar2) {
    p_Var6 = (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)sVar1;
  }
LAB_002b9cf4:
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48);
  return p_Var6 != (_Iter_pred<cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0> *)sVar1;
}

Assistant:

bool cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()
{
  if (cmValue p = this->GeneratorTarget->GetProperty("ghs_integrity_app")) {
    return cmIsOn(*p);
  }
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);
  return std::any_of(sources.begin(), sources.end(),
                     [](cmSourceFile const* sf) -> bool {
                       return "int" == sf->GetExtension();
                     });
}